

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O1

void symmetry_transform(loc_conflict *grid,wchar_t y0,wchar_t x0,wchar_t height,wchar_t width,
                       wchar_t rotate,_Bool reflect)

{
  uint uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar4 = rotate % 4;
  if (0 < iVar4) {
    uVar1 = grid->x;
    uVar6 = grid->y;
    wVar2 = width;
    wVar3 = height;
    do {
      width = wVar3;
      wVar3 = wVar2;
      uVar5 = uVar1;
      uVar7 = ~uVar6;
      iVar4 = iVar4 + -1;
      uVar1 = uVar7 + width;
      uVar6 = uVar5;
      wVar2 = width;
    } while (iVar4 != 0);
    grid->x = uVar7 + width;
    grid->y = uVar5;
  }
  if (reflect) {
    grid->x = width + ~grid->x;
  }
  grid->y = grid->y + y0;
  grid->x = grid->x + x0;
  return;
}

Assistant:

void symmetry_transform(struct loc *grid, int y0, int x0, int height, int width,
						int rotate, bool reflect)
{
	/* Track what the dimensions are after rotations. */
	int rheight = height, rwidth = width;
	int i;

	/* Rotate (in multiples of 90 degrees clockwise) */
	for (i = 0; i < rotate % 4; i++) {
		int temp = grid->x;
		grid->x = rheight - 1 - (grid->y);
		grid->y = temp;
		temp = rwidth;
		rwidth = rheight;
		rheight = temp;
	}

	/* Reflect (horizontally in the rotated system) */
	if (reflect)
		grid->x = rwidth - 1 - grid->x;

	/* Translate */
	grid->y += y0;
	grid->x += x0;
}